

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

int iemgui_getcolorarg(int index,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  long lVar2;
  t_float tVar3;
  int col;
  t_symbol *s;
  t_atom *argv_local;
  int argc_local;
  int index_local;
  
  if ((index < 0) || (argc <= index)) {
    argc_local = 0;
  }
  else if (argv[index].a_type == A_FLOAT) {
    tVar3 = atom_getfloatarg(index,argc,argv);
    argc_local = (int)tVar3;
  }
  else if ((argv[index].a_type == A_SYMBOL) &&
          (ptVar1 = atom_getsymbolarg(index,argc,argv), *ptVar1->s_name == '#')) {
    lVar2 = strtol(ptVar1->s_name + 1,(char **)0x0,0x10);
    argc_local = (uint)lVar2 & 0xffffff;
  }
  else {
    argc_local = 0;
  }
  return argc_local;
}

Assistant:

static int iemgui_getcolorarg(int index, int argc, t_atom*argv)
{
    if(index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        return atom_getfloatarg(index, argc, argv);
    if(IS_A_SYMBOL(argv,index))
    {
        t_symbol*s=atom_getsymbolarg(index, argc, argv);
        if ('#' == s->s_name[0])
        {
            int col = (int)strtol(s->s_name+1, 0, 16);
            return col & 0xFFFFFF;
        }
    }
    return 0;
}